

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_plain.c
# Opt level: O0

CONCRETE_SASL_MECHANISM_HANDLE saslplain_create(void *config)

{
  LOGGER_LOG p_Var1;
  size_t __n;
  size_t __n_00;
  void *pvVar2;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 uVar4;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  LOGGER_LOG l_6;
  size_t init_bytes_length;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  size_t malloc_size;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t passwd_length;
  size_t authcid_length;
  size_t authzid_length;
  LOGGER_LOG l_1;
  SASL_PLAIN_CONFIG *sasl_plain_config;
  LOGGER_LOG l;
  SASL_PLAIN_INSTANCE *result;
  void *config_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (config == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                ,"saslplain_create",0x19,1,"NULL config");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((*config == 0) || (*(long *)((long)config + 8) == 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                ,"saslplain_create",0x26,1,"Bad configuration: authcid = %p, passwd = %p",*config,
                *(undefined8 *)((long)config + 8));
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    if (*(long *)((long)config + 0x10) == 0) {
      local_88 = 0;
    }
    else {
      local_88 = strlen(*(char **)((long)config + 0x10));
    }
    __n = strlen(*config);
    __n_00 = strlen(*(char **)((long)config + 8));
    if ((((__n < 0x100) && (__n != 0)) && (local_88 < 0x100)) && ((__n_00 < 0x100 && (__n_00 != 0)))
       ) {
      l = (LOGGER_LOG)calloc(1,0x10);
      if (l == (LOGGER_LOG)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                    ,"saslplain_create",0x41,1,"Cannot allocate memory for SASL plain instance");
        }
      }
      else {
        if (local_88 < -__n - 1) {
          local_90 = local_88 + __n;
        }
        else {
          local_90 = 0xffffffffffffffff;
        }
        if (local_90 < -__n_00 - 1) {
          local_98 = local_90 + __n_00;
        }
        else {
          local_98 = 0xffffffffffffffff;
        }
        if (local_98 < 0xfffffffffffffffd) {
          local_a0 = local_98 + 2;
        }
        else {
          local_a0 = 0xffffffffffffffff;
        }
        if (local_a0 == 0xffffffffffffffff) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                      ,"saslplain_create",0x4d,1,"malloc size overflow");
          }
          l = (LOGGER_LOG)0x0;
        }
        else {
          pvVar2 = malloc(local_a0);
          *(void **)l = pvVar2;
          if (pvVar2 == (void *)0x0) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                        ,"saslplain_create",0x53,1,"Cannot allocate init bytes");
            }
            free(l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            if (local_88 != 0) {
              memcpy(*(void **)l,*(void **)((long)config + 0x10),local_88);
            }
            if (local_88 < -__n - 1) {
              local_a8 = local_88 + __n;
            }
            else {
              local_a8 = 0xffffffffffffffff;
            }
            if (local_a8 < 0xfffffffffffffffe) {
              if (local_88 < -__n - 1) {
                local_b0 = local_88 + __n;
              }
              else {
                local_b0 = -1;
              }
              local_b8 = local_b0 + 1;
            }
            else {
              local_b8 = 0xffffffffffffffff;
            }
            if ((local_88 < local_a0) && (local_b8 < local_a0)) {
              *(undefined1 *)(*(long *)l + local_88) = 0;
              memcpy((void *)(*(long *)l + local_88 + 1),*config,__n);
              *(undefined1 *)(*(long *)l + local_b8) = 0;
              memcpy((void *)(*(long *)l + local_88 + __n + 2),*(void **)((long)config + 8),__n_00);
              *(int *)(l + 8) = (int)local_88 + (int)__n + (int)__n_00 + 2;
            }
            else {
              p_Var1 = xlogging_get_log_function();
              if (p_Var1 != (LOGGER_LOG)0x0) {
                (*p_Var1)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                          ,"saslplain_create",0x70,1,"invalid buffer size");
              }
              free(*(void **)l);
              free(l);
              l = (LOGGER_LOG)0x0;
            }
          }
        }
      }
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                  ,"saslplain_create",0x37,1,
                  "Bad configuration: authcid length = %u, passwd length = %u",
                  CONCAT44(uVar3,(int)__n),CONCAT44(uVar4,(int)__n_00));
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return l;
}

Assistant:

CONCRETE_SASL_MECHANISM_HANDLE saslplain_create(void* config)
{
    SASL_PLAIN_INSTANCE* result;

    if (config == NULL)
    {
        /* Codes_SRS_SASL_PLAIN_01_003: [If the `config` argument is NULL, then `saslplain_create` shall fail and return NULL.] */
        LogError("NULL config");
        result = NULL;
    }
    else
    {
        SASL_PLAIN_CONFIG* sasl_plain_config = (SASL_PLAIN_CONFIG*)config;

        /* Codes_SRS_SASL_PLAIN_01_025: [ `authzid` shall be optional. ]*/
        if ((sasl_plain_config->authcid == NULL) ||
            (sasl_plain_config->passwd == NULL))
        {
            /* Codes_SRS_SASL_PLAIN_01_004: [If either the `authcid` or `passwd` member of the `config` structure is NULL, then `saslplain_create` shall fail and return NULL.] */
            LogError("Bad configuration: authcid = %p, passwd = %p",
                sasl_plain_config->authcid, sasl_plain_config->passwd);
            result = NULL;
        }
        else
        {
            size_t authzid_length = sasl_plain_config->authzid == NULL ? 0 : strlen(sasl_plain_config->authzid);
            size_t authcid_length = strlen(sasl_plain_config->authcid);
            size_t passwd_length = strlen(sasl_plain_config->passwd);

            /* Codes_SRS_SASL_PLAIN_01_020: [   authcid   = 1*SAFE ; MUST accept up to 255 octets] */
            if ((authcid_length > 255) || (authcid_length == 0) ||
                /* Codes_SRS_SASL_PLAIN_01_021: [   authzid   = 1*SAFE ; MUST accept up to 255 octets] */
                (authzid_length > 255) ||
                /* Codes_SRS_SASL_PLAIN_01_022: [   passwd    = 1*SAFE ; MUST accept up to 255 octets] */
                (passwd_length > 255) || (passwd_length == 0))
            {
                LogError("Bad configuration: authcid length = %u, passwd length = %u",
                    (unsigned int)authcid_length, (unsigned int)passwd_length);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_SASL_PLAIN_01_001: [`saslplain_create` shall return on success a non-NULL handle to a new SASL plain mechanism.] */
                result = (SASL_PLAIN_INSTANCE*)calloc(1, sizeof(SASL_PLAIN_INSTANCE));
                if (result == NULL)
                {
                    /* Codes_SRS_SASL_PLAIN_01_002: [If allocating the memory needed for the saslplain instance fails then `saslplain_create` shall return NULL.] */
                    LogError("Cannot allocate memory for SASL plain instance");
                }
                else
                {
                    /* Ignore UTF8 for now */
                    //size_t malloc_size = authzid_length + authcid_length + passwd_length + 2);  // use safe add
                    size_t malloc_size = safe_add_size_t(authzid_length, authcid_length);
                    malloc_size = safe_add_size_t(malloc_size, passwd_length);
                    malloc_size = safe_add_size_t(malloc_size, 2);

                    if (malloc_size == SIZE_MAX)
                    {
                        LogError("malloc size overflow");
                        result = NULL;
                    }
                    else if ((result->init_bytes = (unsigned char*)malloc(malloc_size)) == NULL)
                    {
                        /* Codes_SRS_SASL_PLAIN_01_002: [If allocating the memory needed for the saslplain instance fails then `saslplain_create` shall return NULL.] */
                        LogError("Cannot allocate init bytes");
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        /* Codes_SRS_SASL_PLAIN_01_016: [The mechanism consists of a single message, a string of [UTF-8] encoded [Unicode] characters, from the client to the server.] */
                        /* Codes_SRS_SASL_PLAIN_01_017: [The client presents the authorization identity (identity to act as), followed by a NUL (U+0000) character, followed by the authentication identity (identity whose password will be used), followed by a NUL (U+0000) character, followed by the clear-text password.] */
                        /* Codes_SRS_SASL_PLAIN_01_019: [   message   = [authzid] UTF8NUL authcid UTF8NUL passwd] */
                        /* Codes_SRS_SASL_PLAIN_01_023: [The authorization identity (authzid), authentication identity (authcid), password (passwd), and NUL character deliminators SHALL be transferred as [UTF-8] encoded strings of [Unicode] characters.] */
                        /* Codes_SRS_SASL_PLAIN_01_024: [As the NUL (U+0000) character is used as a deliminator, the NUL (U+0000) character MUST NOT appear in authzid, authcid, or passwd productions.] */

                        /* Codes_SRS_SASL_PLAIN_01_018: [As with other SASL mechanisms, the client does not provide an authorization identity when it wishes the server to derive an identity from the credentials and use that as the authorization identity.] */
                        if (authzid_length > 0)
                        {
                            (void)memcpy(result->init_bytes, sasl_plain_config->authzid, authzid_length);
                        }

                        size_t init_bytes_length = safe_add_size_t(safe_add_size_t(authzid_length, authcid_length), 1);
                        if (authzid_length < malloc_size && init_bytes_length < malloc_size)
                        {
                            result->init_bytes[authzid_length] = 0;
                            (void)memcpy(result->init_bytes + authzid_length + 1, sasl_plain_config->authcid, authcid_length);
                            result->init_bytes[init_bytes_length] = 0;
                            (void)memcpy(result->init_bytes + authzid_length + authcid_length + 2, sasl_plain_config->passwd, passwd_length);
                            result->init_bytes_length = (uint32_t)(authzid_length + authcid_length + passwd_length + 2);
                        }
                        else
                        {
                            LogError("invalid buffer size");
                            free(result->init_bytes);
                            free(result);
                            result = NULL;
                        }
                    }
                }
            }
        }
    }

    return result;
}